

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O1

void __thiscall Assimp::ObjFile::Mesh::~Mesh(Mesh *this)

{
  Face *this_00;
  pointer pcVar1;
  pointer ppFVar2;
  
  ppFVar2 = (this->m_Faces).
            super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar2 !=
      (this->m_Faces).
      super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppFVar2;
      if (this_00 != (Face *)0x0) {
        Face::~Face(this_00);
        operator_delete(this_00);
      }
      ppFVar2 = ppFVar2 + 1;
    } while (ppFVar2 !=
             (this->m_Faces).
             super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppFVar2 = (this->m_Faces).
            super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar2 != (pointer)0x0) {
    operator_delete(ppFVar2);
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Mesh() {
        for (std::vector<Face*>::iterator it = m_Faces.begin();
            it != m_Faces.end(); ++it)
        {
            delete *it;
        }
    }